

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  long lVar1;
  int iVar2;
  const_reference pvVar3;
  long in_FS_OFFSET;
  int i_local;
  TestResult *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < i) {
    iVar2 = total_part_count(this);
    if (i < iVar2) goto LAB_00197f47;
  }
  internal::posix::Abort();
LAB_00197f47:
  pvVar3 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::at
                     (&this->test_part_results_,(long)i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(i);
}